

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::CLASS_OP(SQVM *this,SQObjectPtr *target,SQInteger baseclass)

{
  SQChar *pSVar1;
  SQClass *pSVar2;
  SQObjectPtr *in_RDX;
  SQVM *in_RDI;
  SQClass *cls;
  SQClass *base;
  SQClass *in_stack_ffffffffffffffd0;
  SQClass *x;
  
  x = (SQClass *)0x0;
  if (in_RDX != (SQObjectPtr *)0xffffffffffffffff) {
    if ((in_RDI->_stack)._vals[(long)&(in_RDX->super_SQObject)._type + in_RDI->_stackbase].
        super_SQObject._type != OT_CLASS) {
      pSVar1 = GetTypeName((SQObjectPtr *)0x169aca);
      Raise_Error(in_RDI,"trying to inherit from a %s",pSVar1);
      return false;
    }
    x = (SQClass *)
        (in_RDI->_stack)._vals[(long)&(in_RDX->super_SQObject)._type + in_RDI->_stackbase].
        super_SQObject._unVal.pThread;
  }
  pSVar2 = SQClass::Create((SQVM *)x,in_stack_ffffffffffffffd0);
  if (pSVar2 != (SQClass *)0x0) {
    ::SQObjectPtr::operator=(in_RDX,x);
  }
  return pSVar2 != (SQClass *)0x0;
}

Assistant:

bool SQVM::CLASS_OP(SQObjectPtr &target,SQInteger baseclass)
{
    SQClass *base = NULL;
    if(baseclass != -1) {
        if (sq_type(_stack._vals[_stackbase+baseclass]) != OT_CLASS) {
            Raise_Error(_SC("trying to inherit from a %s"),GetTypeName(_stack._vals[_stackbase+baseclass]));
            return false;
        }
        base = _class(_stack._vals[_stackbase + baseclass]);
    }
    SQClass *cls = SQClass::Create(this, base);
    if (!cls)
        return false;
    target = cls;
    return true;
}